

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise1d.cpp
# Opt level: O2

int __thiscall
ncnn::DeconvolutionDepthWise1D::forward
          (DeconvolutionDepthWise1D *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  size_t _elemsize;
  int *piVar8;
  long lVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  Mat *pMVar14;
  int iVar15;
  float *pfVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  int iVar20;
  int iVar21;
  float *pfVar22;
  ulong uVar23;
  ulong uVar24;
  void *pvVar25;
  ulong uVar26;
  int k_1;
  ulong uVar27;
  ulong uVar28;
  long lVar29;
  int i_1;
  void *pvVar30;
  int i;
  ulong uVar31;
  long lVar32;
  float *pfVar33;
  ulong uVar34;
  bool bVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  void *local_140;
  Mat local_108;
  Option *local_b8;
  ulong local_b0;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  Mat *local_88;
  long local_80;
  long local_78;
  ulong local_70;
  long local_68;
  ulong local_60;
  void *local_58;
  long local_50;
  long local_48;
  ulong local_40;
  long local_38;
  
  iVar20 = bottom_blob->w;
  iVar2 = this->kernel_w;
  iVar3 = this->dilation_w;
  local_a8._8_8_ = local_a8._0_8_;
  local_a8._0_8_ = bottom_blob;
  _elemsize = bottom_blob->elemsize;
  iVar21 = this->stride_w;
  iVar15 = this->output_pad_right;
  local_108.cstep = 0;
  local_108.data = (float *)0x0;
  local_108.refcount._0_4_ = 0;
  local_108.refcount._4_4_ = 0;
  local_108.elemsize._0_4_ = 0;
  local_108.elemsize._4_4_ = 0;
  local_108.elempack = 0;
  local_108.allocator = (Allocator *)0x0;
  local_108.dims = 0;
  local_108.w = 0;
  local_108.h = 0;
  local_108.d = 0;
  local_108.c = 0;
  lVar29 = 0x10;
  if ((((this->pad_left < 1) && (this->pad_right < 1)) && (this->output_w < 1)) &&
     (lVar29 = 8, &local_108 != top_blob)) {
    piVar8 = top_blob->refcount;
    if (piVar8 != (int *)0x0) {
      LOCK();
      *piVar8 = *piVar8 + 1;
      UNLOCK();
    }
    local_108.data = top_blob->data;
    local_108.refcount._0_4_ = SUB84(top_blob->refcount,0);
    local_108.refcount._4_4_ = (undefined4)((ulong)top_blob->refcount >> 0x20);
    local_108.elemsize._0_4_ = (undefined4)top_blob->elemsize;
    local_108.elemsize._4_4_ = (undefined4)(top_blob->elemsize >> 0x20);
    local_108.elempack = top_blob->elempack;
    local_108.allocator = top_blob->allocator;
    uVar10 = top_blob->dims;
    uVar11 = top_blob->w;
    uVar12 = top_blob->h;
    uVar13 = top_blob->d;
    local_108.c = top_blob->c;
    local_108.cstep = top_blob->cstep;
    local_108.dims = uVar10;
    local_108.w = uVar11;
    local_108.h = uVar12;
    local_108.d = uVar13;
  }
  local_b8 = opt;
  Mat::create(&local_108,iVar15 + (iVar2 + -1) * iVar3 + (iVar20 + -1) * iVar21 + 1,this->num_output
              ,_elemsize,*(Allocator **)(&opt->lightmode + lVar29));
  iVar20 = -100;
  if (((float *)local_108.data != (float *)0x0) && ((long)local_108.c * local_108.cstep != 0)) {
    uVar4 = this->group;
    pvVar25 = (this->bias_data).data;
    if (pvVar25 == (void *)0x0) {
      bVar35 = true;
    }
    else {
      bVar35 = (long)(this->bias_data).c * (this->bias_data).cstep == 0;
    }
    uVar5 = this->kernel_w;
    iVar20 = this->stride_w;
    iVar2 = this->dilation_w;
    iVar3 = this->activation_type;
    uVar6 = *(uint *)(local_a8._0_8_ + 0x2c);
    lVar29 = (long)local_108.w;
    uVar18 = 0;
    local_b0 = 0;
    if (0 < (int)uVar4) {
      local_b0 = (ulong)uVar4;
    }
    local_88 = top_blob;
    if (local_108.h == uVar4 && *(uint *)(local_a8._0_8_ + 0x30) == uVar4) {
      local_98._0_8_ = *(undefined8 *)local_a8._0_8_;
      lVar32 = *(long *)(local_a8._0_8_ + 0x10);
      pvVar30 = (this->weight_data).data;
      uVar18 = 0;
      uVar27 = 0;
      if (0 < local_108.w) {
        uVar27 = (ulong)(uint)local_108.w;
      }
      uVar34 = 0;
      if (0 < (int)uVar5) {
        uVar34 = (ulong)uVar5;
      }
      uVar31 = 0;
      if (0 < (int)uVar6) {
        uVar31 = (ulong)uVar6;
      }
      lVar9 = CONCAT44(local_108.elemsize._4_4_,(undefined4)local_108.elemsize);
      pfVar33 = (float *)local_108.data;
      for (; uVar18 != local_b0; uVar18 = uVar18 + 1) {
        fVar36 = 0.0;
        if (!bVar35) {
          fVar36 = *(float *)((long)pvVar25 + uVar18 * 4);
        }
        for (lVar17 = 0; (int)uVar27 != (int)lVar17; lVar17 = lVar17 + 1) {
          pfVar33[lVar17] = fVar36;
        }
        pfVar16 = pfVar33;
        for (uVar19 = 0; uVar19 != uVar31; uVar19 = uVar19 + 1) {
          fVar36 = *(float *)((int)uVar6 * lVar32 * uVar18 + local_98._0_8_ + uVar19 * 4);
          pfVar22 = pfVar16;
          for (uVar24 = 0; uVar34 != uVar24; uVar24 = uVar24 + 1) {
            *pfVar22 = *(float *)((long)pvVar30 + uVar24 * 4) * fVar36 + *pfVar22;
            pfVar22 = pfVar22 + iVar2;
          }
          pfVar16 = pfVar16 + iVar20;
        }
        pfVar16 = (float *)(this->activation_params).data;
        for (uVar19 = 0; uVar27 != uVar19; uVar19 = uVar19 + 1) {
          fVar36 = pfVar33[uVar19];
          fVar38 = fVar36;
          switch(iVar3) {
          case 1:
            if (fVar36 <= 0.0) {
              fVar38 = 0.0;
            }
            break;
          case 2:
            fVar38 = (float)(~-(uint)(0.0 < fVar36) & (uint)*pfVar16 |
                            -(uint)(0.0 < fVar36) & 0x3f800000) * fVar36;
            break;
          case 3:
            if (fVar36 <= *pfVar16) {
              fVar36 = *pfVar16;
            }
            fVar38 = pfVar16[1];
            if (fVar36 <= pfVar16[1]) {
              fVar38 = fVar36;
            }
            break;
          case 4:
            if (88.37626 <= fVar36) {
              fVar36 = 88.37626;
            }
            fVar36 = expf((float)(-(uint)(fVar36 < -88.37626) & 0x42b0c0a5 |
                                 ~-(uint)(fVar36 < -88.37626) & (uint)-fVar36));
            fVar38 = 1.0 / (fVar36 + 1.0);
            break;
          case 5:
            local_a8 = ZEXT416((uint)fVar36);
            fVar36 = expf(fVar36);
            fVar36 = logf(fVar36 + 1.0);
            fVar36 = tanhf(fVar36);
            fVar38 = fVar36 * (float)local_a8._0_4_;
            break;
          case 6:
            fVar1 = *pfVar16;
            fVar37 = -pfVar16[1] / fVar1;
            fVar38 = 0.0;
            if ((fVar37 <= fVar36) && (fVar38 = fVar36, fVar36 <= fVar37 + 1.0 / fVar1)) {
              fVar38 = (fVar1 * fVar36 + pfVar16[1]) * fVar36;
            }
          }
          pfVar33[uVar19] = fVar38;
        }
        pfVar33 = (float *)((long)pfVar33 + lVar29 * lVar9);
        pvVar30 = (void *)((long)pvVar30 + (long)(int)uVar5 * 4);
      }
    }
    else {
      uVar27 = (long)(int)*(uint *)(local_a8._0_8_ + 0x30) / (long)(int)uVar4;
      iVar21 = (int)uVar27;
      uVar34 = 0;
      if (0 < (int)uVar5) {
        uVar34 = (ulong)uVar5;
      }
      uVar31 = 0;
      if (0 < iVar21) {
        uVar31 = uVar27 & 0xffffffff;
      }
      uVar27 = (ulong)uVar6;
      if ((int)uVar6 < 1) {
        uVar27 = uVar18;
      }
      uVar19 = (ulong)(uint)local_108.w;
      if (local_108.w < 1) {
        uVar19 = uVar18;
      }
      iVar15 = (int)((long)local_108.h / (long)(int)uVar4);
      uVar24 = 0;
      if (0 < iVar15) {
        uVar24 = (long)local_108.h / (long)(int)uVar4 & 0xffffffff;
      }
      local_78 = (long)iVar21;
      local_80 = (long)iVar15;
      local_48 = (long)(int)(iVar21 * uVar5) << 2;
      lVar29 = 0;
      uVar26 = 0;
      while (uVar26 != local_b0) {
        local_50 = uVar26 * local_80;
        lVar32 = uVar26 * local_78;
        local_40 = 0;
        if (0 < local_108.w) {
          local_40 = (ulong)(uint)local_108.w;
        }
        local_38 = (long)local_108.w *
                   CONCAT44(local_108.elemsize._4_4_,(undefined4)local_108.elemsize);
        pfVar33 = (float *)(local_38 * lVar29 + (long)local_108.data);
        local_58 = (this->bias_data).data;
        local_140 = (void *)((long)(int)uVar18 * 4 + (long)(this->weight_data).data);
        local_70 = uVar26;
        local_68 = lVar29;
        local_60 = uVar18;
        for (uVar23 = 0; uVar23 != uVar24; uVar23 = uVar23 + 1) {
          fVar36 = 0.0;
          if (!bVar35) {
            fVar36 = *(float *)((long)local_58 + (local_50 + uVar23) * 4);
          }
          for (lVar29 = 0; (int)local_40 != (int)lVar29; lVar29 = lVar29 + 1) {
            pfVar33[lVar29] = fVar36;
          }
          pfVar16 = pfVar33;
          for (uVar18 = 0; uVar18 != uVar27; uVar18 = uVar18 + 1) {
            iVar7 = *(int *)(local_a8._0_8_ + 0x2c);
            lVar29 = *(long *)(local_a8._0_8_ + 0x10);
            lVar9 = *(long *)local_a8._0_8_;
            pvVar25 = local_140;
            for (uVar26 = 0; uVar26 != uVar31; uVar26 = uVar26 + 1) {
              fVar36 = *(float *)(uVar18 * 4 + lVar9 + (uVar26 + lVar32) * iVar7 * lVar29);
              pfVar22 = pfVar16;
              for (uVar28 = 0; uVar34 != uVar28; uVar28 = uVar28 + 1) {
                *pfVar22 = *(float *)((long)pvVar25 + uVar28 * 4) * fVar36 + *pfVar22;
                pfVar22 = pfVar22 + iVar2;
              }
              pvVar25 = (void *)((long)pvVar25 + (long)(int)uVar5 * 4);
            }
            pfVar16 = pfVar16 + iVar20;
          }
          pfVar16 = (float *)(this->activation_params).data;
          for (uVar18 = 0; uVar19 != uVar18; uVar18 = uVar18 + 1) {
            fVar36 = pfVar33[uVar18];
            fVar38 = fVar36;
            switch(iVar3) {
            case 1:
              if (fVar36 <= 0.0) {
                fVar38 = 0.0;
              }
              break;
            case 2:
              fVar38 = (float)(~-(uint)(0.0 < fVar36) & (uint)*pfVar16 |
                              -(uint)(0.0 < fVar36) & 0x3f800000) * fVar36;
              break;
            case 3:
              if (fVar36 <= *pfVar16) {
                fVar36 = *pfVar16;
              }
              fVar38 = pfVar16[1];
              if (fVar36 <= pfVar16[1]) {
                fVar38 = fVar36;
              }
              break;
            case 4:
              if (88.37626 <= fVar36) {
                fVar36 = 88.37626;
              }
              fVar36 = expf((float)(-(uint)(fVar36 < -88.37626) & 0x42b0c0a5 |
                                   ~-(uint)(fVar36 < -88.37626) & (uint)-fVar36));
              fVar38 = 1.0 / (fVar36 + 1.0);
              break;
            case 5:
              local_98 = ZEXT416((uint)fVar36);
              fVar36 = expf(fVar36);
              fVar36 = logf(fVar36 + 1.0);
              fVar36 = tanhf(fVar36);
              fVar38 = fVar36 * (float)local_98._0_4_;
              break;
            case 6:
              fVar1 = *pfVar16;
              fVar37 = -pfVar16[1] / fVar1;
              fVar38 = 0.0;
              if ((fVar37 <= fVar36) && (fVar38 = fVar36, fVar36 <= fVar37 + 1.0 / fVar1)) {
                fVar38 = (fVar1 * fVar36 + pfVar16[1]) * fVar36;
              }
            }
            pfVar33[uVar18] = fVar38;
          }
          pfVar33 = (float *)((long)pfVar33 + local_38);
          local_140 = (void *)((long)local_140 + local_48);
        }
        lVar29 = local_68 + local_80;
        uVar18 = (ulong)((int)local_60 + iVar15 * iVar21 * uVar5);
        uVar26 = local_70 + 1;
      }
    }
    pMVar14 = local_88;
    cut_padding(this,&local_108,local_88,local_b8);
    if ((pMVar14->data == (void *)0x0) || (iVar20 = 0, (long)pMVar14->c * pMVar14->cstep == 0)) {
      iVar20 = -100;
    }
  }
  piVar8 = (int *)CONCAT44(local_108.refcount._4_4_,local_108.refcount._0_4_);
  if (piVar8 != (int *)0x0) {
    LOCK();
    *piVar8 = *piVar8 + -1;
    UNLOCK();
    if (*piVar8 == 0) {
      if (local_108.allocator == (Allocator *)0x0) {
        free(local_108.data);
      }
      else {
        (*(local_108.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar20;
}

Assistant:

int DeconvolutionDepthWise1D::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    size_t elemsize = bottom_blob.elemsize;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || output_w > 0)
    {
        top_blob_bordered.create(outw, num_output, elemsize, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, num_output, elemsize, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    int ret = deconvolutiondepthwise1d(bottom_blob, top_blob_bordered, weight_data, bias_data, kernel_w, stride_w, dilation_w, group, activation_type, activation_params, opt);
    if (ret != 0)
        return ret;

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}